

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O0

void Nwk_ManDelayTracePrint(Nwk_Man_t *pNtk)

{
  uint uVar1;
  If_LibLut_t *pIVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  void *__s;
  Nwk_Obj_t *p;
  char *pcVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  uint local_60;
  int local_4c;
  float Num;
  float nSteps;
  float tDelta;
  float tArrival;
  int *pCounters;
  int Nodes;
  int i;
  Nwk_Obj_t *pNode;
  If_LibLut_t *pLutLib;
  Nwk_Man_t *pNtk_local;
  
  pIVar2 = pNtk->pLutLib;
  if ((pIVar2 == (If_LibLut_t *)0x0) ||
     (iVar5 = pIVar2->LutMax, iVar3 = Nwk_ManGetFaninMax(pNtk), iVar3 <= iVar5)) {
    if (pIVar2 == (If_LibLut_t *)0x0) {
      local_4c = Nwk_ManLevelMax(pNtk);
    }
    else {
      local_4c = 0x14;
    }
    fVar8 = (float)local_4c;
    uVar7 = (ulong)(fVar8 + 1.0);
    __s = malloc((uVar7 | (long)((fVar8 + 1.0) - 9.223372e+18) & (long)uVar7 >> 0x3f) << 2);
    fVar9 = (fVar8 + 1.0) * 4.0;
    uVar7 = (ulong)fVar9;
    memset(__s,0,uVar7 | (long)(fVar9 - 9.223372e+18) & (long)uVar7 >> 0x3f);
    fVar9 = Nwk_ManDelayTraceLut(pNtk);
    for (pCounters._4_4_ = 0; iVar5 = Vec_PtrSize(pNtk->vObjs), pCounters._4_4_ < iVar5;
        pCounters._4_4_ = pCounters._4_4_ + 1) {
      p = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vObjs,pCounters._4_4_);
      if (((p != (Nwk_Obj_t *)0x0) && (iVar5 = Nwk_ObjIsNode(p), iVar5 != 0)) &&
         (iVar5 = Nwk_ObjFaninNum(p), iVar5 != 0)) {
        fVar10 = Nwk_ObjSlack(p);
        fVar10 = fVar10 / (fVar9 / fVar8);
        if (fVar10 <= fVar8) {
          if ((fVar10 < 0.0) || (fVar8 < fVar10)) {
            __assert_fail("Num >=0 && Num <= nSteps",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkTiming.c"
                          ,0x1e7,"void Nwk_ManDelayTracePrint(Nwk_Man_t *)");
          }
          *(int *)((long)__s + (long)(int)fVar10 * 4) =
               *(int *)((long)__s + (long)(int)fVar10 * 4) + 1;
        }
      }
    }
    pcVar6 = "unit-delay";
    if (pIVar2 != (If_LibLut_t *)0x0) {
      pcVar6 = "LUT library";
    }
    printf("Max delay = %6.2f. Delay trace using %s model:\n",(double)fVar9,pcVar6);
    pCounters._0_4_ = 0;
    for (pCounters._4_4_ = 0; (float)pCounters._4_4_ < fVar8; pCounters._4_4_ = pCounters._4_4_ + 1)
    {
      pCounters._0_4_ = *(int *)((long)__s + (long)pCounters._4_4_ * 4) + (uint)pCounters;
      if (pIVar2 == (If_LibLut_t *)0x0) {
        local_60 = pCounters._4_4_ + 1;
      }
      else {
        local_60 = (pCounters._4_4_ + 1) * 5;
      }
      pcVar6 = "lev";
      if (pIVar2 != (If_LibLut_t *)0x0) {
        pcVar6 = "%";
      }
      iVar5 = Nwk_ManNodeNum(pNtk);
      printf("%3d %s : %5d  (%6.2f %%)\n",((double)(int)(uint)pCounters * 100.0) / (double)iVar5,
             (ulong)local_60,pcVar6,(ulong)(uint)pCounters);
    }
    if (__s != (void *)0x0) {
      free(__s);
    }
  }
  else {
    uVar1 = pIVar2->LutMax;
    uVar4 = Nwk_ManGetFaninMax(pNtk);
    printf("The max LUT size (%d) is less than the max fanin count (%d).\n",(ulong)uVar1,
           (ulong)uVar4);
  }
  return;
}

Assistant:

void Nwk_ManDelayTracePrint( Nwk_Man_t * pNtk )
{
    If_LibLut_t * pLutLib = pNtk->pLutLib;
    Nwk_Obj_t * pNode;
    int i, Nodes, * pCounters;
    float tArrival, tDelta, nSteps, Num;
    // get the library
    if ( pLutLib && pLutLib->LutMax < Nwk_ManGetFaninMax(pNtk) )
    {
        printf( "The max LUT size (%d) is less than the max fanin count (%d).\n", 
            pLutLib->LutMax, Nwk_ManGetFaninMax(pNtk) );
        return;
    }
    // decide how many steps
    nSteps = pLutLib ? 20 : Nwk_ManLevelMax(pNtk);
    pCounters = ABC_ALLOC( int, nSteps + 1 );
    memset( pCounters, 0, sizeof(int)*(nSteps + 1) );
    // perform delay trace
    tArrival = Nwk_ManDelayTraceLut( pNtk );
    tDelta = tArrival / nSteps;
    // count how many nodes have slack in the corresponding intervals
    Nwk_ManForEachNode( pNtk, pNode, i )
    {
        if ( Nwk_ObjFaninNum(pNode) == 0 )
            continue;
        Num = Nwk_ObjSlack(pNode) / tDelta;
        if ( Num > nSteps )
            continue;
        assert( Num >=0 && Num <= nSteps );
        pCounters[(int)Num]++;
    }
    // print the results
    printf( "Max delay = %6.2f. Delay trace using %s model:\n", tArrival, pLutLib? "LUT library" : "unit-delay" );
    Nodes = 0;
    for ( i = 0; i < nSteps; i++ )
    {
        Nodes += pCounters[i];
        printf( "%3d %s : %5d  (%6.2f %%)\n", pLutLib? 5*(i+1) : i+1, 
            pLutLib? "%":"lev", Nodes, 100.0*Nodes/Nwk_ManNodeNum(pNtk) );
    }
    ABC_FREE( pCounters );
}